

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
alphabet_histogram<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,comm *comm)

{
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> hist;
  comm *comm_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *out_hist;
  
  hist.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)comm;
  get_histogram<unsigned_long,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,begin,end,0x100);
  mxx::allreduce<unsigned_long>
            (__return_storage_ptr__,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
             (comm *)hist.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<index_t> alphabet_histogram(InputIterator begin, InputIterator end, const mxx::comm& comm) {
    static_assert(std::is_same<typename std::iterator_traits<InputIterator>::value_type, char>::value, "Iterator must be of value type `char`.");
    // get local histogram of alphabet characters
    std::vector<index_t> hist = get_histogram<index_t>(begin, end, 256);
    std::vector<index_t> out_hist = mxx::allreduce(hist, comm);
    return out_hist;
}